

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O3

void __thiscall
CircularArrayTest_const_operator_brackets_Test::TestBody
          (CircularArrayTest_const_operator_brackets_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  Message local_60;
  undefined1 local_58 [9];
  undefined7 uStack_4f;
  AssertHelper local_48;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_40;
  
  local_40.contents_._M_elems[0].data = 0;
  local_40.contents_._M_elems[0].data2 = 0;
  local_40.contents_._M_elems[0].moved = false;
  local_40.contents_._M_elems[1].data = 0;
  local_40.contents_._M_elems[1].data2 = 0;
  local_40.contents_._M_elems[1].moved = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 3;
  local_40.size_ = 0;
  local_40.front_ = 0;
  local_58._0_4_ = 1;
  local_58._4_4_ = 0;
  local_58[8] = false;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_40,(value_type *)local_58);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_58._0_4_ = 2;
  local_58._4_4_ = 0;
  local_58[8] = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 1;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_40,(value_type *)local_58);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_60.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"1","cca[0].data",(int *)&local_60,
             &local_40.contents_._M_elems[(uint)local_40.front_ & 1].data);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(uStack_4f,local_58[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-circular-array.cc"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((CONCAT44(local_60.ss_.ptr_._4_4_,local_60.ss_.ptr_._0_4_) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT44(local_60.ss_.ptr_._4_4_,local_60.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_.ptr_._4_4_,local_60.ss_.ptr_._0_4_) + 8))();
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_60.ss_.ptr_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"2","cca[1].data",(int *)&local_60,
               &local_40.contents_._M_elems[~(uint)local_40.front_ & 1].data);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message(&local_60);
      if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)CONCAT71(uStack_4f,local_58[8]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-circular-array.cc"
                 ,0x98,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((CONCAT44(local_60.ss_.ptr_._4_4_,local_60.ss_.ptr_._0_4_) != 0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         ((long *)CONCAT44(local_60.ss_.ptr_._4_4_,local_60.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_60.ss_.ptr_._4_4_,local_60.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_40);
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_operator_brackets) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, cca[0].data);
  ASSERT_EQ(2, cca[1].data);
}